

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void BuildVertexWeightMapping
               (Primitive *primitive,
               vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               *map)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  Accessor *pAVar5;
  size_type sVar6;
  reference this;
  vector<aiVertexWeight,std::allocator<aiVertexWeight>> *this_00;
  uint local_64;
  uint local_58;
  float local_54;
  uint local_50;
  float weight;
  uint bone;
  int j;
  size_t i;
  Indices16 *indices16;
  Indices8 *indices8;
  Weights *weights;
  size_t num_vertices;
  Attributes *attr;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  *map_local;
  Primitive *primitive_local;
  
  num_vertices = (size_t)&primitive->attributes;
  attr = (Attributes *)map;
  map_local = (vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               *)primitive;
  bVar2 = std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
          empty(&(primitive->attributes).weight);
  if ((!bVar2) &&
     (bVar2 = std::
              vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
              empty((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                     *)(num_vertices + 0x78)), !bVar2)) {
    pvVar4 = std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
             ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)(num_vertices + 0xa8),0);
    pAVar5 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar4);
    sVar1 = pAVar5->count;
    pvVar4 = std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
             ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)(num_vertices + 0x78),0);
    pAVar5 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar4);
    if (sVar1 == pAVar5->count) {
      pvVar4 = std::
               vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
               operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)(num_vertices + 0xa8),0);
      pAVar5 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar4);
      weights = (Weights *)pAVar5->count;
      indices8 = (Indices8 *)0x0;
      pvVar4 = std::
               vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
               operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)(num_vertices + 0xa8),0);
      pAVar5 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar4);
      glTF2::Accessor::
      ExtractData<BuildVertexWeightMapping(glTF2::Mesh::Primitive&,std::vector<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>,std::allocator<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>>>&)::Weights>
                (pAVar5,(Weights **)&indices8);
      indices16 = (Indices16 *)0x0;
      i = 0;
      pvVar4 = std::
               vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
               operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                           *)(num_vertices + 0x78),0);
      pAVar5 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar4);
      uVar3 = glTF2::Accessor::GetElementSize(pAVar5);
      if (uVar3 == 4) {
        pvVar4 = std::
                 vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                 ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                               *)(num_vertices + 0x78),0);
        pAVar5 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar4);
        glTF2::Accessor::
        ExtractData<BuildVertexWeightMapping(glTF2::Mesh::Primitive&,std::vector<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>,std::allocator<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>>>&)::Indices8>
                  (pAVar5,(Indices8 **)&indices16);
      }
      else {
        pvVar4 = std::
                 vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                 ::operator[]((vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                               *)(num_vertices + 0x78),0);
        pAVar5 = glTF2::Ref<glTF2::Accessor>::operator->(pvVar4);
        glTF2::Accessor::
        ExtractData<BuildVertexWeightMapping(glTF2::Mesh::Primitive&,std::vector<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>,std::allocator<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>>>&)::Indices16>
                  (pAVar5,(Indices16 **)&i);
      }
      if ((indices16 == (Indices16 *)0x0) && (i == 0)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Importer.cpp"
                      ,0x329,
                      "void BuildVertexWeightMapping(Mesh::Primitive &, std::vector<std::vector<aiVertexWeight>> &)"
                     );
      }
      for (_bone = (Weights *)0x0; _bone < weights; _bone = (Weights *)((long)_bone->values + 1)) {
        for (weight = 0.0; (int)weight < 4; weight = (float)((int)weight + 1)) {
          if (indices16 == (Indices16 *)0x0) {
            local_64 = (uint)*(ushort *)(i + (long)_bone * 8 + (long)(int)weight * 2);
          }
          else {
            local_64 = (uint)*(byte *)((long)indices16->values + (long)(int)weight + (long)_bone * 4
                                      );
          }
          local_50 = local_64;
          local_54 = *(float *)indices8[(long)_bone * 4 + (long)(int)weight].values;
          if ((0.0 < local_54) &&
             (sVar6 = std::
                      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ::size((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                              *)attr), local_64 < sVar6)) {
            this = std::
                   vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                 *)attr,(ulong)local_50);
            std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve(this,8);
            this_00 = (vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)
                      std::
                      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                    *)attr,(ulong)local_50);
            local_58 = (uint)_bone;
            std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
            emplace_back<unsigned_int,float_const&>(this_00,&local_58,&local_54);
          }
        }
      }
      if (indices8 != (Indices8 *)0x0) {
        operator_delete__(indices8);
      }
      if (indices16 != (Indices16 *)0x0) {
        operator_delete__(indices16);
      }
      if (i != 0) {
        operator_delete__((void *)i);
      }
    }
  }
  return;
}

Assistant:

static void BuildVertexWeightMapping(Mesh::Primitive &primitive, std::vector<std::vector<aiVertexWeight>> &map) {
	Mesh::Primitive::Attributes &attr = primitive.attributes;
	if (attr.weight.empty() || attr.joint.empty()) {
		return;
	}
	if (attr.weight[0]->count != attr.joint[0]->count) {
		return;
	}

	size_t num_vertices = attr.weight[0]->count;

	struct Weights {
		float values[4];
	};
	Weights *weights = nullptr;
	attr.weight[0]->ExtractData(weights);

	struct Indices8 {
		uint8_t values[4];
	};
	struct Indices16 {
		uint16_t values[4];
	};
	Indices8 *indices8 = nullptr;
	Indices16 *indices16 = nullptr;
	if (attr.joint[0]->GetElementSize() == 4) {
		attr.joint[0]->ExtractData(indices8);
	} else {
		attr.joint[0]->ExtractData(indices16);
	}
	//
	if (nullptr == indices8 && nullptr == indices16) {
		// Something went completely wrong!
		ai_assert(false);
		return;
	}

	for (size_t i = 0; i < num_vertices; ++i) {
		for (int j = 0; j < 4; ++j) {
			const unsigned int bone = (indices8 != nullptr) ? indices8[i].values[j] : indices16[i].values[j];
			const float weight = weights[i].values[j];
			if (weight > 0 && bone < map.size()) {
				map[bone].reserve(8);
				map[bone].emplace_back(static_cast<unsigned int>(i), weight);
			}
		}
	}

	delete[] weights;
	delete[] indices8;
	delete[] indices16;
}